

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::pop_reg(Rdma *this,Memslot id)

{
  uint uVar1;
  pointer pMVar2;
  long lVar3;
  Memslot id_local;
  
  id_local = id;
  if (id != 0xfffffffffffffffe) {
    lVar3 = (long)this->m_nprocs * id;
    pMVar2 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = pMVar2[lVar3 + this->m_pid].status;
    if ((uVar1 & 2) != 0) {
      __assert_fail("id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x41,"void bsplib::Rdma::pop_reg(Memslot)");
    }
    pMVar2[lVar3 + this->m_pid].status = uVar1 | 2;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&(this->m_send_push_pop_comm_buf).m_popped_slots,&id_local);
  return;
}

Assistant:

void Rdma::pop_reg( Memslot id )
{
    assert( id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED) );
    if ( id != null_slot() ) {
        slot( m_pid, id ).status |= Memblock::POPPED;
    }
    m_send_push_pop_comm_buf.m_popped_slots.push_back( id );
}